

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.h
# Opt level: O0

string * __thiscall wallet::BerkeleyRODatabase::Filename_abi_cxx11_(BerkeleyRODatabase *this)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fs::PathToString_abi_cxx11_((path *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string Filename() override { return fs::PathToString(m_filepath); }